

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  int iVar1;
  iterator __position;
  int iVar2;
  long *plVar3;
  int new_index;
  FieldDescriptor *local_20;
  int local_14;
  
  local_20 = field;
  if ((*(char *)((long)this + 0x40) != '\0') ||
     ((*(long **)((long)this + 0x48) != *(long **)((long)this + 0x50) &&
      (*(long *)(**(long **)((long)this + 0x48) + 0x58) != *(long *)(field + 0x58))))) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
  }
  if (*(long *)(local_20 + 0x58) == 0) {
    if (((*(char *)(*(long *)(local_20 + 0x78) + 0x4f) == '\0') && (*(int *)(local_20 + 0x3c) != 3))
       && (*(char *)((long)this + 0x40) == '\0')) {
      if (local_20[0x42] == (FieldDescriptor)0x0) {
        plVar3 = (long *)(*(long *)(local_20 + 0x50) + 0x28);
      }
      else if (*(long *)(local_20 + 0x60) == 0) {
        plVar3 = (long *)(*(long *)(local_20 + 0x28) + 0x80);
      }
      else {
        plVar3 = (long *)(*(long *)(local_20 + 0x60) + 0x50);
      }
      iVar1 = *(int *)(*(long *)(*this + 0x108) +
                      (long)((int)((ulong)((long)local_20 - *plVar3) >> 3) * 0x286bca1b) * 4);
      iVar2 = iVar1 + 0x1f;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      if (*(int *)((long)this + 0x60) != iVar2 >> 5) {
        local_14 = iVar2 >> 5;
        Formatter::operator()
                  ((Formatter *)((long)this + 8),"cached_has_bits = _has_bits_[$1$];\n",&local_14);
        *(int *)((long)this + 0x60) = local_14;
      }
    }
    GenerateSerializeOneField
              (*this,*(Printer **)((long)this + 8),local_20,*(int *)((long)this + 0x60));
  }
  else {
    __position._M_current = *(FieldDescriptor ***)((long)this + 0x50);
    if (__position._M_current == *(FieldDescriptor ***)((long)this + 0x58)) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)((long)this + 0x48),__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
    }
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            format_("cached_has_bits = _has_bits_[$1$];\n", new_index);

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(format_.printer(), field,
                                       cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }